

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSSimpleTypeDefinition.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XSSimpleTypeDefinition::XSSimpleTypeDefinition
          (XSSimpleTypeDefinition *this,DatatypeValidator *datatypeValidator,VARIETY stVariety,
          XSTypeDefinition *xsBaseType,XSSimpleTypeDefinition *primitiveOrItemType,
          XSSimpleTypeDefinitionList *memberTypes,XSAnnotation *headAnnot,XSModel *xsModel,
          MemoryManager *manager)

{
  short *psVar1;
  uint uVar2;
  BaseRefVectorOf<xercesc_4_0::XSAnnotation> *this_00;
  XMLSize_t XVar3;
  int iVar4;
  XMLSize_t index;
  XSAnnotationList *pXVar5;
  undefined4 extraout_var;
  long lVar6;
  
  XSTypeDefinition::XSTypeDefinition
            (&this->super_XSTypeDefinition,SIMPLE_TYPE,xsBaseType,xsModel,manager);
  (this->super_XSTypeDefinition).super_XSObject._vptr_XSObject =
       (_func_int **)&PTR__XSSimpleTypeDefinition_00414338;
  this->fDefinedFacets = 0;
  this->fFixedFacets = 0;
  this->fVariety = stVariety;
  this->fDatatypeValidator = datatypeValidator;
  this->fXSFacetList = (XSFacetList *)0x0;
  this->fXSMultiValueFacetList = (XSMultiValueFacetList *)0x0;
  this->fPatternList = (StringList *)0x0;
  this->fPrimitiveOrItemType = primitiveOrItemType;
  this->fMemberTypes = memberTypes;
  this->fXSAnnotationList = (XSAnnotationList *)0x0;
  uVar2 = datatypeValidator->fFinalSet;
  if (uVar2 != 0) {
    if ((uVar2 & 2) != 0) {
      psVar1 = &(this->super_XSTypeDefinition).fFinal;
      *(byte *)psVar1 = (byte)*psVar1 | 1;
    }
    if ((uVar2 & 4) != 0) {
      psVar1 = &(this->super_XSTypeDefinition).fFinal;
      *(byte *)psVar1 = (byte)*psVar1 | 2;
    }
    if ((uVar2 & 8) != 0) {
      psVar1 = &(this->super_XSTypeDefinition).fFinal;
      *(byte *)psVar1 = (byte)*psVar1 | 0x10;
    }
    if ((uVar2 & 0x10) != 0) {
      psVar1 = &(this->super_XSTypeDefinition).fFinal;
      *(byte *)psVar1 = (byte)*psVar1 | 8;
    }
  }
  if (headAnnot != (XSAnnotation *)0x0) {
    pXVar5 = (XSAnnotationList *)XMemory::operator_new(0x30,manager);
    (pXVar5->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>)._vptr_BaseRefVectorOf =
         (_func_int **)&PTR__BaseRefVectorOf_00413a58;
    (pXVar5->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>).fAdoptedElems = false;
    (pXVar5->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>).fCurCount = 0;
    (pXVar5->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>).fMaxCount = 3;
    (pXVar5->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>).fElemList = (XSAnnotation **)0x0;
    (pXVar5->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>).fMemoryManager = manager;
    iVar4 = (*manager->_vptr_MemoryManager[3])(manager,0x18);
    (pXVar5->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>).fElemList =
         (XSAnnotation **)CONCAT44(extraout_var,iVar4);
    lVar6 = 0;
    do {
      (pXVar5->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>).fElemList[lVar6] =
           (XSAnnotation *)0x0;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    (pXVar5->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>)._vptr_BaseRefVectorOf =
         (_func_int **)&PTR__RefVectorOf_004139e0;
    this->fXSAnnotationList = pXVar5;
    do {
      this_00 = &this->fXSAnnotationList->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>;
      BaseRefVectorOf<xercesc_4_0::XSAnnotation>::ensureExtraCapacity(this_00,1);
      XVar3 = this_00->fCurCount;
      this_00->fElemList[XVar3] = headAnnot;
      this_00->fCurCount = XVar3 + 1;
      headAnnot = XSAnnotation::getNext(headAnnot);
    } while (headAnnot != (XSAnnotation *)0x0);
  }
  return;
}

Assistant:

XSSimpleTypeDefinition::XSSimpleTypeDefinition
(
    DatatypeValidator* const            datatypeValidator
    , VARIETY                           stVariety
    , XSTypeDefinition* const           xsBaseType
    , XSSimpleTypeDefinition* const     primitiveOrItemType
    , XSSimpleTypeDefinitionList* const memberTypes
    , XSAnnotation*                     headAnnot
    , XSModel* const                    xsModel
    , MemoryManager* const              manager
)
    : XSTypeDefinition(SIMPLE_TYPE, xsBaseType, xsModel, manager)
    , fDefinedFacets(0)
    , fFixedFacets(0)
    , fVariety(stVariety)
    , fDatatypeValidator(datatypeValidator)
    , fXSFacetList(0)
    , fXSMultiValueFacetList(0)
    , fPatternList(0)
    , fPrimitiveOrItemType(primitiveOrItemType)
    , fMemberTypes(memberTypes)
    , fXSAnnotationList(0)
{
    int finalset = fDatatypeValidator->getFinalSet();
    if (finalset)
    {
        if (finalset & SchemaSymbols::XSD_EXTENSION)
            fFinal |= XSConstants::DERIVATION_EXTENSION;

        if (finalset & SchemaSymbols::XSD_RESTRICTION)
            fFinal |= XSConstants::DERIVATION_RESTRICTION;

        if (finalset & SchemaSymbols::XSD_LIST)
            fFinal |= XSConstants::DERIVATION_LIST;

        if (finalset & SchemaSymbols::XSD_UNION)
            fFinal |= XSConstants::DERIVATION_UNION;
    }

    if (headAnnot)
    {
        XSAnnotation* annot = headAnnot;

        fXSAnnotationList = new (manager) RefVectorOf<XSAnnotation>(3, false, manager);
        do
        {
            fXSAnnotationList->addElement(annot);
            annot = annot->getNext();
        } while (annot);
    }
}